

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpointer.hpp
# Opt level: O3

void jsoncons::jsonpointer::
     replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *root,
               basic_json_pointer<char> *location,
               basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value,
               bool create_if_missing,error_code *ec)

{
  pointer pbVar1;
  undefined8 uVar2;
  bool bVar3;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *pkVar4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this;
  uint uVar5;
  undefined7 in_register_00000009;
  jsonpointer_errc __e;
  pointer pbVar6;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this_00;
  type tVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> buffer;
  size_t index;
  detail *local_88;
  key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *local_80;
  detail local_78 [20];
  undefined4 local_64;
  undefined1 local_60 [24];
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *local_48;
  string_view_type local_40;
  
  local_88 = local_78;
  local_80 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
              *)0x0;
  local_78[0] = (detail)0x0;
  pbVar6 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (location->tokens_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)root;
  if (pbVar6 != pbVar1) {
    local_64 = (undefined4)CONCAT71(in_register_00000009,create_if_missing);
    local_48 = value;
    do {
      std::__cxx11::string::_M_assign((string *)&local_88);
      pbVar6 = pbVar6 + 1;
      if (pbVar6 == pbVar1) {
        create_if_missing = SUB41(local_64,0);
        this_00 = (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)root;
        value = local_48;
        goto LAB_0039cd5b;
      }
      local_60._0_8_ = local_80;
      local_60._8_8_ = local_88;
      root = detail::
             resolve<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>>
                       (root,(string_view_type *)local_60,create_if_missing,ec);
    } while (ec->_M_value == 0);
    goto LAB_0039ce53;
  }
LAB_0039cd5b:
  while( true ) {
    uVar5 = (byte)*(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)root &
            0xf;
    if (1 < uVar5 - 8) break;
    root = *(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> **)
            ((long)root + 8);
  }
  if (uVar5 == 0xe) {
    if ((local_80 ==
         (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          *)0x1) && (*local_88 == (detail)0x2d)) {
      __e = index_exceeds_array_size;
    }
    else {
      local_60._0_8_ =
           (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
            *)0x0;
      tVar7 = jsoncons::detail::dec_to_integer<unsigned_long,char>
                        (local_88,(char *)local_80,(size_t)local_60,(unsigned_long *)(ulong)uVar5);
      uVar2 = local_60._0_8_;
      __e = invalid_index;
      if (tVar7.ec == success) {
        pkVar4 = (key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                  *)basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::size
                              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                                *)this_00);
        __e = index_exceeds_array_size;
        if ((ulong)uVar2 < pkVar4) {
          this = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::at
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)this_00,local_60._0_8_);
          if (this != value) {
            basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
            copy_assignment(this,value);
          }
          goto LAB_0039ce53;
        }
      }
    }
  }
  else {
    bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_object
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )this_00);
    if (bVar3) {
      local_60._0_8_ = local_80;
      local_60._8_8_ = local_88;
      bVar3 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::contains
                        ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)this_00,(string_view_type *)local_60);
      if (bVar3) {
        local_40._M_len = (size_t)local_80;
        local_40._M_str = (char *)local_88;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        insert_or_assign<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_60,this_00,&local_40,value);
        goto LAB_0039ce53;
      }
      if (create_if_missing != false) {
        local_40._M_len = (size_t)local_80;
        local_40._M_str = (char *)local_88;
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        try_emplace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
                  ((pair<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>,_void>,_bool>
                    *)local_60,this_00,&local_40,value);
        goto LAB_0039ce53;
      }
      __e = key_not_found;
    }
    else {
      __e = expected_object_or_array;
    }
  }
  std::error_code::operator=(ec,__e);
LAB_0039ce53:
  replace<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
            ();
  return;
}

Assistant:

void replace(Json& root, 
                 const basic_json_pointer<typename Json::char_type>& location, 
                 T&& value, 
                 bool create_if_missing,
                 std::error_code& ec)
    {
        Json* current = std::addressof(root);

        std::basic_string<typename Json::char_type> buffer;
        auto it = location.begin();
        auto end = location.end();

        while (it != end)
        {
            buffer = *it;
            ++it;
            if (it != end)
            {
                current = jsoncons::jsonpointer::detail::resolve(current, buffer, create_if_missing, ec);
                if (JSONCONS_UNLIKELY(ec))
                    return;
            }
        }
        if (current->is_array())
        {
            if (buffer.size() == 1 && buffer[0] == '-')
            {
                ec = jsonpointer_errc::index_exceeds_array_size;
                return;
            }
            else
            {
                std::size_t index{};
                auto result = jsoncons::detail::dec_to_integer(buffer.data(), buffer.length(), index);
                if (!result)
                {
                    ec = jsonpointer_errc::invalid_index;
                    return;
                }
                if (index >= current->size())
                {
                    ec = jsonpointer_errc::index_exceeds_array_size;
                    return;
                }
                current->at(index) = std::forward<T>(value);
            }
        }
        else if (current->is_object())
        {
            if (!current->contains(buffer))
            {
                if (create_if_missing)
                {
                    current->try_emplace(buffer,std::forward<T>(value));
                }
                else
                {
                    ec = jsonpointer_errc::key_not_found;
                    return;
                }
            }
            else
            {
                auto r = current->insert_or_assign(buffer,std::forward<T>(value));
                current = std::addressof(r.first->value());
            }
        }
        else
        {
            ec = jsonpointer_errc::expected_object_or_array;
            return;
        }
    }